

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  JavaType JVar2;
  char *text;
  
  bVar1 = IsByteStringWithCustomDefaultValue(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "private static final $field_type$ $bytes_default$ = $default$;\n");
  }
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"private $field_type$ $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_message$;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  return $name$_;\n}\n")
  ;
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$($type$ value) {\n$null_check$  $set_has_field_bit_message$\n  $name$_ = value;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $clear_has_field_bit_message$\n");
  JVar2 = GetJavaType(this->descriptor_);
  text = "  $name$_ = $default$;\n";
  if (JVar2 - JAVATYPE_STRING < 2) {
    text = "  $name$_ = getDefaultInstance().get$capitalized_name$();\n";
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,"}\n");
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  if (IsByteStringWithCustomDefaultValue(descriptor_)) {
    // allocate this once statically since we know ByteStrings are immutable
    // values that can be reused.
    printer->Print(
        variables_,
        "private static final $field_type$ $bytes_default$ = $default$;\n");
  }
  printer->Print(variables_,
    "private $field_type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_message$;\n"
      "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  return $name$_;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "$null_check$"
    "  $set_has_field_bit_message$\n"
    "  $name$_ = value;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $clear_has_field_bit_message$\n");
  JavaType type = GetJavaType(descriptor_);
  if (type == JAVATYPE_STRING || type == JAVATYPE_BYTES) {
    // The default value is not a simple literal so we want to avoid executing
    // it multiple times.  Instead, get the default out of the default instance.
    printer->Print(variables_,
      "  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
  } else {
    printer->Print(variables_,
      "  $name$_ = $default$;\n");
  }
  printer->Print(variables_,
    "}\n");
}